

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

void __thiscall testing::internal::CapturedStream::~CapturedStream(CapturedStream *this)

{
  pointer pcVar1;
  
  remove((this->filename_)._M_dataplus._M_p);
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~CapturedStream() {
    remove(filename_.c_str());
  }